

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text)

{
  runtime_error *this_00;
  char *pcVar1;
  char *text_local;
  CommentInfo *this_local;
  
  if (this->comment_ != (char *)0x0) {
    releaseStringValue(this->comment_);
  }
  if (text != (char *)0x0) {
    if ((*text != '\0') && (*text != '/')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"in Json::Value::setComment(): Comments must start with /");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = duplicateStringValue(text,0xffffffff);
    this->comment_ = pcVar1;
    return;
  }
  __assert_fail("text != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x93,"void Json::Value::CommentInfo::setComment(const char *)");
}

Assistant:

void Value::CommentInfo::setComment(const char* text) {
  if (comment_)
    releaseStringValue(comment_);
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text);
}